

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

NoCopy kj::_::convertToReturn<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>
                 (ExceptionOr<NoCopy> *result)

{
  NoCopy *pNVar1;
  Exception *pEVar2;
  Exception *exception_1;
  Exception *_exception92;
  Exception *exception;
  Exception *_exception88;
  NoCopy *value;
  NoCopy *_value87;
  ExceptionOr<NoCopy> *result_local;
  
  pNVar1 = readMaybe<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>(&result->value);
  if (pNVar1 != (NoCopy *)0x0) {
    pEVar2 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)result);
    if (pEVar2 != (Exception *)0x0) {
      pEVar2 = mv<kj::Exception>(pEVar2);
      throwRecoverableException(pEVar2,0);
    }
    pNVar1 = mv<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>(pNVar1);
    pNVar1 = returnMaybeVoid<kj::(anonymous_namespace)::TestCase726::run()::NoCopy>(pNVar1);
    return (NoCopy)pNVar1->i;
  }
  pEVar2 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)result);
  if (pEVar2 != (Exception *)0x0) {
    pEVar2 = mv<kj::Exception>(pEVar2);
    throwFatalException(pEVar2,0);
  }
  unreachable();
}

Assistant:

inline T convertToReturn(ExceptionOr<T>&& result) {
  KJ_IF_SOME(value, result.value) {
    KJ_IF_SOME(exception, result.exception) {
      throwRecoverableException(kj::mv(exception));
    }
    return _::returnMaybeVoid(kj::mv(value));
  } else KJ_IF_SOME(exception, result.exception) {
    throwFatalException(kj::mv(exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }